

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * __thiscall
util::make_string<char_const(&)[49],CylHead&>
          (string *__return_storage_ptr__,util *this,char (*args) [49],CylHead *args_1)

{
  ostringstream local_198 [8];
  ostringstream ss;
  CylHead *args_local_1;
  char (*args_local) [49];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,(char *)this);
  ::operator<<((ostream *)local_198,(CylHead *)args);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}